

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall
QWidgetPrivate::reparentWidgetWindowChildren(QWidgetPrivate *this,QWidget *parentWithWindow)

{
  bool bVar1;
  QWidgetPrivate *this_00;
  const_iterator o;
  QObject **ppQVar2;
  QWidget *pQVar3;
  QWidget *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *childPrivate;
  QWidget *childWidget;
  QObject *child;
  add_const_t<QList<QObject_*>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  WindowFlags in_stack_0000009c;
  QWidgetPrivate *in_stack_ffffffffffffff98;
  QList<QObject_*> *in_stack_ffffffffffffffa0;
  QWidget *parentWithWindow_00;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetPrivate *)(in_RDI + 0x18);
  local_10.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QObject_*>::begin(in_stack_ffffffffffffffa0);
  o = QList<QObject_*>::end(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    ppQVar2 = QList<QObject_*>::const_iterator::operator*(&local_10);
    parentWithWindow_00 = (QWidget *)*ppQVar2;
    pQVar3 = qobject_cast<QWidget*>((QObject *)in_stack_ffffffffffffff98);
    if (pQVar3 != (QWidget *)0x0) {
      in_stack_ffffffffffffff98 = get((QWidget *)0x37ec45);
      QWidget::windowFlags(in_RSI);
      reparentWidgetWindows(this_00,parentWithWindow_00,in_stack_0000009c);
    }
    QList<QObject_*>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::reparentWidgetWindowChildren(QWidget *parentWithWindow)
{
    for (auto *child : std::as_const(children)) {
        if (auto *childWidget = qobject_cast<QWidget*>(child)) {
            auto *childPrivate = QWidgetPrivate::get(childWidget);
            // Child widgets with QWindows should always continue to be child
            // windows, so we pass on the child's current window flags here.
            childPrivate->reparentWidgetWindows(parentWithWindow, childWidget->windowFlags());
        }
    }
}